

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prodcons1.c
# Opt level: O1

void * consumer(void *arg)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  if (0 < nitems) {
    uVar4 = 0;
    do {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar4;
      iVar2 = sem_wait((sem_t *)shared.nstored);
      if (iVar2 != 0) {
        consumer_cold_1();
      }
      iVar2 = sem_wait((sem_t *)shared.mutex);
      if (iVar2 != 0) {
        consumer_cold_2();
      }
      lVar5 = (SUB168(auVar1 * ZEXT816(0xcccccccccccccccd),8) & 0xfffffffffffffff8) * -5;
      uVar3 = (uint)((int)((uVar4 & 0xffffffff) / 10) * -10) + uVar4;
      printf("consuming %d at %d\n",uVar4 & 0xffffffff,uVar3 & 0xffffffff);
      if ((int)uVar4 != *(int *)((long)&shared + lVar5 + uVar4 * 4)) {
        fprintf(_stderr,"[%s:%d]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons1.c"
                ,0x4e);
        err_sys("buff[%d] = %d, should be %d",uVar3 & 0xffffffff,
                *(undefined4 *)((long)&shared + lVar5 + uVar4 * 4),uVar4 & 0xffffffff);
      }
      iVar2 = sem_post((sem_t *)shared.mutex);
      if (iVar2 != 0) {
        consumer_cold_3();
      }
      iVar2 = sem_post((sem_t *)shared.nempty);
      if (iVar2 != 0) {
        consumer_cold_4();
      }
      uVar4 = uVar4 + 1;
    } while ((int)uVar4 < nitems);
  }
  return (void *)0x0;
}

Assistant:

void * consumer(void * arg) {
  int i;
  for (i = 0; i < nitems; ++i) {
    ASSERT_ERR_QUIT(sem_wait(shared.nstored) == 0, "Failed to wait for nstored");
    ASSERT_ERR_QUIT(sem_wait(shared.mutex) == 0, "Failed to wait for mutex");
    printf("consuming %d at %d\n", i, i % NBUFF);
    ASSERT_ERR_SYS(shared.buff[i % NBUFF] == i, "buff[%d] = %d, should be %d",
      i % NBUFF, shared.buff[i % NBUFF], i);
    ASSERT_ERR_QUIT(sem_post(shared.mutex) == 0, "Failed to post to mutex");
    ASSERT_ERR_QUIT(sem_post(shared.nempty) == 0, "Failed to post to nempty");
  }

  return NULL;
}